

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::addDestinationTarget
          (CommonCore *this,InterfaceHandle handle,string_view dest,InterfaceType hint)

{
  char cVar1;
  ushort uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t sVar5;
  size_t sVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar7;
  InvalidIdentifier *pIVar8;
  char *pcVar9;
  action_t newAction;
  string_view string1;
  string_view string1_00;
  string_view message;
  string_view message_00;
  string_view string2;
  string_view string2_00;
  size_t sStack_f0;
  string_view dest_local;
  undefined1 local_d0 [16];
  undefined8 local_c0;
  ulong local_b8;
  Time TStack_b0;
  Time local_a8;
  Time TStack_a0;
  Time local_98;
  SmallBuffer SStack_90;
  pointer pbStack_30;
  pointer local_28;
  pointer pbStack_20;
  
  dest_local._M_str = dest._M_str;
  dest_local._M_len = dest._M_len;
  ppVar7 = getHandleInfo(this,handle);
  if (ppVar7 == (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    pIVar8 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar9 = "invalid handle";
    sStack_f0 = 0xe;
LAB_0028555c:
    message._M_str = pcVar9;
    message._M_len = sStack_f0;
    InvalidIdentifier::InvalidIdentifier(pIVar8,message);
    __cxa_throw(pIVar8,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  uVar2 = *(ushort *)((long)&(ppVar7->first)._M_string_length + 6);
  if ((uVar2 >> 0xe & 1) != 0) {
    pIVar8 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar9 = "Interface is receive only and cannot have destination targets";
    sStack_f0 = 0x3d;
    goto LAB_0028555c;
  }
  SStack_90.heap = local_d0 + 0x40;
  local_d0._0_4_ = cmd_ignore;
  local_d0._4_4_ = 0;
  local_c0._0_4_ = 0;
  local_c0._4_4_ = -1700000000;
  TStack_b0.internalTimeCode = 0;
  local_a8.internalTimeCode = 0;
  TStack_a0.internalTimeCode = 0;
  local_98.internalTimeCode = 0;
  SStack_90.buffer._M_elems[0] = 0;
  SStack_90.buffer._M_elems[1] = 0;
  SStack_90.buffer._M_elems[2] = 0;
  SStack_90.buffer._M_elems[3] = 0;
  SStack_90.buffer._M_elems[4] = 0;
  SStack_90.buffer._M_elems[5] = 0;
  SStack_90.buffer._M_elems[6] = 0;
  SStack_90.buffer._M_elems[7] = 0;
  SStack_90.buffer._M_elems[8] = 0;
  SStack_90.buffer._M_elems[9] = 0;
  SStack_90.buffer._M_elems[10] = 0;
  SStack_90.buffer._M_elems[0xb] = 0;
  SStack_90.buffer._M_elems[0xc] = 0;
  SStack_90.buffer._M_elems[0xd] = 0;
  SStack_90.buffer._M_elems[0xe] = 0;
  SStack_90.buffer._M_elems[0xf] = 0;
  SStack_90.buffer._M_elems[0x10] = 0;
  SStack_90.buffer._M_elems[0x11] = 0;
  SStack_90.buffer._M_elems[0x12] = 0;
  SStack_90.buffer._M_elems[0x13] = 0;
  SStack_90.buffer._M_elems[0x14] = 0;
  SStack_90.buffer._M_elems[0x15] = 0;
  SStack_90.buffer._M_elems[0x16] = 0;
  SStack_90.buffer._M_elems[0x17] = 0;
  SStack_90.buffer._M_elems[0x18] = 0;
  SStack_90.buffer._M_elems[0x19] = 0;
  SStack_90.buffer._M_elems[0x1a] = 0;
  SStack_90.buffer._M_elems[0x1b] = 0;
  SStack_90.buffer._M_elems[0x1c] = 0;
  SStack_90.buffer._M_elems[0x1d] = 0;
  SStack_90.buffer._M_elems[0x1e] = 0;
  SStack_90.buffer._M_elems[0x1f] = 0;
  SStack_90.buffer._M_elems[0x20] = 0;
  SStack_90.buffer._M_elems[0x21] = 0;
  SStack_90.buffer._M_elems[0x22] = 0;
  SStack_90.buffer._M_elems[0x23] = 0;
  SStack_90.buffer._M_elems[0x24] = 0;
  SStack_90.buffer._M_elems[0x25] = 0;
  SStack_90.buffer._M_elems[0x26] = 0;
  SStack_90.buffer._M_elems[0x27] = 0;
  SStack_90.buffer._M_elems[0x28] = 0;
  SStack_90.buffer._M_elems[0x29] = 0;
  SStack_90.buffer._M_elems[0x2a] = 0;
  SStack_90.buffer._M_elems[0x2b] = 0;
  SStack_90.buffer._M_elems[0x2c] = 0;
  SStack_90.buffer._M_elems[0x2d] = 0;
  SStack_90.buffer._M_elems[0x2e] = 0;
  SStack_90.buffer._M_elems[0x2f] = 0;
  SStack_90.buffer._M_elems[0x30] = 0;
  SStack_90.buffer._M_elems[0x31] = 0;
  SStack_90.buffer._M_elems[0x32] = 0;
  SStack_90.buffer._M_elems[0x33] = 0;
  SStack_90.buffer._M_elems[0x34] = 0;
  SStack_90.buffer._M_elems[0x35] = 0;
  SStack_90.buffer._M_elems[0x36] = 0;
  SStack_90.buffer._M_elems[0x37] = 0;
  SStack_90.buffer._M_elems[0x38] = 0;
  SStack_90.buffer._M_elems[0x39] = 0;
  SStack_90.buffer._M_elems[0x3a] = 0;
  SStack_90.buffer._M_elems[0x3b] = 0;
  SStack_90.buffer._M_elems[0x3c] = 0;
  SStack_90.buffer._M_elems[0x3d] = 0;
  SStack_90.buffer._M_elems[0x3e] = 0;
  SStack_90.buffer._M_elems[0x3f] = 0;
  SStack_90.bufferSize = 0;
  SStack_90.bufferCapacity = 0x40;
  SStack_90.nonOwning = false;
  SStack_90.locked = false;
  SStack_90.usingAllocatedBuffer = false;
  SStack_90.errorCondition = '\0';
  SStack_90.userKey = 0;
  pbStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  pbStack_20 = (pointer)0x0;
  local_d0._8_8_ = (ppVar7->first)._M_dataplus._M_p;
  local_b8 = (ulong)CONCAT22(uVar2,(short)*(char *)((long)&(ppVar7->first)._M_string_length + 4)) |
             0x20000;
  SmallBuffer::operator=((SmallBuffer *)SStack_90.heap,&dest_local);
  cVar1 = *(char *)((long)&(ppVar7->first)._M_string_length + 4);
  if (cVar1 == 'e') {
    ActionMessage::setAction
              ((ActionMessage *)local_d0,(uint)(hint != FILTER) * 2 + cmd_add_named_filter);
  }
  else {
    if (cVar1 == 'f') {
      ActionMessage::setAction((ActionMessage *)local_d0,cmd_add_named_endpoint);
      if (*(long *)((long)&(ppVar7->first).field_2 + 8) == 0) {
        puVar3 = (undefined8 *)ppVar7[1].second.field_2._M_allocated_capacity;
        puVar4 = *(undefined8 **)((long)&ppVar7[1].second.field_2 + 8);
        sVar5 = puVar3[1];
        sVar6 = puVar4[1];
        if (sVar5 != 0 || sVar6 != 0) {
          string1._M_str = (char *)*puVar3;
          string1._M_len = sVar5;
          string2._M_str = (char *)*puVar4;
          string2._M_len = sVar6;
          ActionMessage::setStringData((ActionMessage *)local_d0,string1,string2);
        }
      }
      if (((ppVar7->first)._M_string_length & 0x200000000000000) != 0) {
        local_b8 = local_b8 | 0x2000000;
      }
      goto LAB_0028550b;
    }
    if (cVar1 != 'p') {
      if (cVar1 != 't') {
        if (cVar1 == 's') {
          pIVar8 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
          pcVar9 = "Data sinks cannot have destination targets";
          sStack_f0 = 0x2a;
        }
        else {
          pIVar8 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
          pcVar9 = "inputs cannot have destination targets";
          sStack_f0 = 0x26;
        }
LAB_002855a7:
        message_00._M_str = pcVar9;
        message_00._M_len = sStack_f0;
        InvalidIdentifier::InvalidIdentifier(pIVar8,message_00);
        __cxa_throw(pIVar8,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
      }
      if (hint == ENDPOINT) {
        newAction = cmd_add_named_endpoint;
      }
      else if (hint == FILTER) {
        newAction = cmd_add_named_filter;
      }
      else {
        newAction = cmd_add_named_input;
        if (hint != INPUT) {
          if (hint == PUBLICATION) {
            pIVar8 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
            pcVar9 = "translators cannot have publications as destination targets";
            sStack_f0 = 0x3b;
            goto LAB_002855a7;
          }
          ActionMessage::setAction((ActionMessage *)local_d0,cmd_add_named_endpoint);
          BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_d0);
        }
      }
      ActionMessage::setAction((ActionMessage *)local_d0,newAction);
      goto LAB_0028550b;
    }
    ActionMessage::setAction((ActionMessage *)local_d0,cmd_add_named_input);
  }
  if (*(long *)((long)&(ppVar7->first).field_2 + 8) == 0) {
    string1_00._M_str = (char *)(ppVar7->second).field_2._M_allocated_capacity;
    string1_00._M_len = *(size_t *)((long)&(ppVar7->second).field_2 + 8);
    string2_00._M_str = (char *)ppVar7[1].first.field_2._M_allocated_capacity;
    string2_00._M_len = *(size_t *)((long)&ppVar7[1].first.field_2 + 8);
    ActionMessage::setStringData((ActionMessage *)local_d0,string1_00,string2_00);
  }
LAB_0028550b:
  BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_d0);
  ActionMessage::~ActionMessage((ActionMessage *)local_d0);
  return;
}

Assistant:

void CommonCore::addDestinationTarget(InterfaceHandle handle,
                                      std::string_view dest,
                                      InterfaceType hint)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, receive_only_flag)) {
        throw(InvalidIdentifier("Interface is receive only and cannot have destination targets"));
    }
    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.flags = handleInfo->flags;
    cmd.counter = static_cast<uint16_t>(handleInfo->handleType);
    setActionFlag(cmd, destination_target);
    cmd.payload = dest;
    switch (handleInfo->handleType) {
        case InterfaceType::ENDPOINT:
            if (hint == InterfaceType::FILTER) {
                cmd.setAction(CMD_ADD_NAMED_FILTER);
            } else {
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            }
            if (handleInfo->key.empty()) {
                cmd.setStringData(handleInfo->type, handleInfo->units);
            }
            break;
        case InterfaceType::TRANSLATOR:
            switch (hint) {
                case InterfaceType::INPUT:
                    cmd.setAction(CMD_ADD_NAMED_INPUT);
                    break;
                case InterfaceType::PUBLICATION:
                    throw(InvalidIdentifier(
                        "translators cannot have publications as destination targets"));
                    break;
                case InterfaceType::ENDPOINT:
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
                case InterfaceType::FILTER:
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    break;
                default:
                    // translators have two outputs
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    // need to send 2 messages then one now and one at the end
                    addActionMessage(cmd);
                    cmd.setAction(CMD_ADD_NAMED_INPUT);
                    break;
            }
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            if (handleInfo->key.empty()) {
                if ((!handleInfo->type_in.empty()) || (!handleInfo->type_out.empty())) {
                    cmd.setStringData(handleInfo->type_in, handleInfo->type_out);
                }
            }
            if (checkActionFlag(*handleInfo, clone_flag)) {
                setActionFlag(cmd, clone_flag);
            }
            break;
        case InterfaceType::PUBLICATION:
            cmd.setAction(CMD_ADD_NAMED_INPUT);
            if (handleInfo->key.empty()) {
                cmd.setStringData(handleInfo->type, handleInfo->units);
            }
            break;
        case InterfaceType::SINK:
            throw(InvalidIdentifier("Data sinks cannot have destination targets"));
        case InterfaceType::INPUT:
        default:
            throw(InvalidIdentifier("inputs cannot have destination targets"));
    }

    addActionMessage(std::move(cmd));
}